

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.cpp
# Opt level: O0

void __thiscall
CoreML::TreeEnsembleClassifier::TreeEnsembleClassifier
          (TreeEnsembleClassifier *this,string *predictedClassOutputName,
          string *classProbabilityOutputName,string *description)

{
  string *psVar1;
  element_type *peVar2;
  TreeEnsembleClassifier *pTVar3;
  ArenaStringPtr *pAVar4;
  Arena *pAVar5;
  Model local_60;
  string *local_48;
  string *description_local;
  string *classProbabilityOutputName_local;
  string *predictedClassOutputName_local;
  TreeEnsembleClassifier *this_local;
  ModelDescription *local_20;
  string *local_18;
  ModelDescription *local_10;
  
  local_48 = description;
  description_local = classProbabilityOutputName;
  classProbabilityOutputName_local = predictedClassOutputName;
  predictedClassOutputName_local = (string *)this;
  Model::Model(&local_60,description);
  TreeEnsembleBase::TreeEnsembleBase(&this->super_TreeEnsembleBase,&local_60,true);
  Model::~Model(&local_60);
  (this->super_TreeEnsembleBase).super_Model._vptr_Model =
       (_func_int **)&PTR__TreeEnsembleClassifier_006fb390;
  peVar2 = std::
           __shared_ptr_access<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&(this->super_TreeEnsembleBase).super_Model.m_spec);
  pTVar3 = Specification::Model::mutable_treeensembleclassifier(peVar2);
  this->tree_classifier_parameters = pTVar3;
  peVar2 = std::
           __shared_ptr_access<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&(this->super_TreeEnsembleBase).super_Model.m_spec);
  local_20 = Specification::Model::mutable_description(peVar2);
  psVar1 = classProbabilityOutputName_local;
  this_local = (TreeEnsembleClassifier *)classProbabilityOutputName_local;
  pAVar4 = &local_20->predictedfeaturename_;
  pAVar5 = google::protobuf::MessageLite::GetArenaForAllocation(&local_20->super_MessageLite);
  google::protobuf::internal::ArenaStringPtr::Set(pAVar4,psVar1,pAVar5);
  peVar2 = std::
           __shared_ptr_access<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&(this->super_TreeEnsembleBase).super_Model.m_spec);
  local_10 = Specification::Model::mutable_description(peVar2);
  psVar1 = description_local;
  local_18 = description_local;
  pAVar4 = &local_10->predictedprobabilitiesname_;
  pAVar5 = google::protobuf::MessageLite::GetArenaForAllocation(&local_10->super_MessageLite);
  google::protobuf::internal::ArenaStringPtr::Set(pAVar4,psVar1,pAVar5);
  return;
}

Assistant:

TreeEnsembleClassifier::TreeEnsembleClassifier
    (const std::string& predictedClassOutputName,
     const std::string& classProbabilityOutputName,
     const std::string& description)
    : TreeEnsembleBase(Model(description), true /* isClassifier */),
      tree_classifier_parameters(m_spec->mutable_treeensembleclassifier())
    {
        m_spec->mutable_description()->set_predictedfeaturename(predictedClassOutputName);
        m_spec->mutable_description()->set_predictedprobabilitiesname(classProbabilityOutputName);
    }